

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::SetPostCaseCallback(TestResponseProxy *this,CBPrePostHook *cbPostCase)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  undefined1 local_28 [8];
  Ref testModule;
  CBPrePostHook *cbPostCase_local;
  TestResponseProxy *this_local;
  
  testModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cbPostCase;
  TestRunner::GetCurrentTestModule();
  bVar2 = std::operator==((shared_ptr<trun::TestModule> *)local_28,(nullptr_t)0x0);
  _Var1 = testModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    peVar3 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    peVar3->cbPostHook = (CBPrePostHook)(_Var1._M_pi)->_vptr__Sp_counted_base;
  }
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_28);
  return;
}

Assistant:

void TestResponseProxy::SetPostCaseCallback(const CBPrePostHook &cbPostCase) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->cbPostHook = cbPostCase;
    }
}